

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

int __thiscall Map_Chest::AddItem(Map_Chest *this,short item_id,int amount,int slot)

{
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *this_00;
  int iVar1;
  _List_node_base *p_Var2;
  int iVar3;
  Map_Chest_Item chestitem;
  value_type local_14;
  
  iVar3 = 0;
  iVar1 = 0;
  if (0 < amount) {
    iVar1 = iVar3;
    if (slot == 0) {
      p_Var2 = (_List_node_base *)&this->items;
      do {
        p_Var2 = (((_List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)&p_Var2->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var2 == (_List_node_base *)&this->items) goto LAB_0015661b;
      } while (*(short *)&p_Var2[1]._M_next != item_id);
      iVar3 = *(int *)((long)&p_Var2[1]._M_next + 4) + amount;
      if ((-1 < iVar3) && (iVar3 <= this->maxchest)) {
        *(int *)((long)&p_Var2[1]._M_next + 4) = iVar3;
        iVar1 = amount;
      }
    }
    else {
LAB_0015661b:
      iVar1 = 0;
      if (((this->items).super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>._M_impl.
           _M_node._M_size < (ulong)(long)this->chestslots) &&
         (iVar1 = iVar3, amount <= this->maxchest)) {
        this_00 = &this->items;
        local_14.id = item_id;
        local_14.amount = amount;
        if (slot == 0) {
          iVar3 = 0;
          p_Var2 = (_List_node_base *)this_00;
          while (p_Var2 = (((_List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)
                           &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var2 != (_List_node_base *)this_00) {
            iVar3 = iVar3 + (uint)(*(int *)&p_Var2[1]._M_prev == 0);
          }
          iVar1 = 0;
          if (iVar3 + this->slots < this->chestslots) {
            local_14.slot = 0;
            std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::push_back
                      (this_00,&local_14);
            iVar1 = amount;
          }
        }
        else {
          local_14.slot = slot;
          std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::push_front
                    (this_00,&local_14);
          iVar1 = amount;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int Map_Chest::AddItem(short item_id, int amount, int slot)
{
	if (amount <= 0)
	{
		return 0;
	}

	if (slot == 0)
	{
		UTIL_FOREACH_REF(this->items, item)
		{
			if (item.id == item_id)
			{
				if (item.amount + amount < 0 || item.amount + amount > this->maxchest)
				{
					return 0;
				}

				item.amount += amount;
				return amount;
			}
		}
	}

	if (this->items.size() >= static_cast<std::size_t>(this->chestslots) || amount > this->maxchest)
	{
		return 0;
	}

	if (slot == 0)
	{
		int user_items = 0;

		UTIL_FOREACH(this->items, item)
		{
			if (item.slot == 0)
			{
				++user_items;
			}
		}

		if (user_items + this->slots >= this->chestslots)
		{
			return 0;
		}
	}

	Map_Chest_Item chestitem;
	chestitem.id = item_id;
	chestitem.amount = amount;
	chestitem.slot = slot;

	if (slot == 0)
	{
		this->items.push_back(chestitem);
	}
	else
	{
		this->items.push_front(chestitem);
	}

	return amount;
}